

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O2

void __thiscall
IntBounds::IntBounds
          (IntBounds *this,IntConstantBounds *constantBounds,
          bool wasConstantUpperBoundEstablishedExplicitly,JitArenaAllocator *allocator)

{
  int32 iVar1;
  
  iVar1 = constantBounds->upperBound;
  this->constantLowerBound = constantBounds->lowerBound;
  this->constantUpperBound = iVar1;
  this->wasConstantUpperBoundEstablishedExplicitly = wasConstantUpperBoundEstablishedExplicitly;
  JsUtil::
  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&(this->relativeLowerBounds).
                    super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ,allocator,0);
  JsUtil::
  BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&(this->relativeUpperBounds).
                    super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ,allocator,0);
  return;
}

Assistant:

IntBounds::IntBounds(
    const IntConstantBounds &constantBounds,
    const bool wasConstantUpperBoundEstablishedExplicitly,
    JitArenaAllocator *const allocator)
    :
    constantLowerBound(constantBounds.LowerBound()),
    constantUpperBound(constantBounds.UpperBound()),
    wasConstantUpperBoundEstablishedExplicitly(wasConstantUpperBoundEstablishedExplicitly),
    relativeLowerBounds(allocator),
    relativeUpperBounds(allocator)
{
}